

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O3

int region_get_data(region *reg,char *buf,int len)

{
  uint uVar1;
  ulong uVar2;
  line *plVar4;
  int iVar5;
  ulong uVar3;
  
  if (len < 1) {
    uVar1 = 0;
  }
  else {
    plVar4 = reg->r_linep;
    iVar5 = reg->r_offset;
    uVar2 = 0;
    do {
      if (iVar5 == plVar4->l_used) {
        plVar4 = plVar4->l_fp;
        uVar3 = uVar2;
        if (plVar4 == curbp->b_headp) break;
        buf[uVar2] = *curbp->b_nlchr;
        iVar5 = 0;
      }
      else {
        buf[uVar2] = plVar4->l_text[iVar5];
        iVar5 = iVar5 + 1;
      }
      uVar2 = uVar2 + 1;
      uVar3 = (ulong)(uint)len;
    } while ((uint)len != uVar2);
    uVar1 = (uint)uVar3;
  }
  buf[uVar1] = '\0';
  return uVar1;
}

Assistant:

int
region_get_data(struct region *reg, char *buf, int len)
{
	int	 i, off;
	struct line	*lp;

	off = reg->r_offset;
	lp = reg->r_linep;
	for (i = 0; i < len; i++) {
		if (off == llength(lp)) {
			lp = lforw(lp);
			if (lp == curbp->b_headp)
				break;
			off = 0;
			buf[i] = *curbp->b_nlchr;
		} else {
			buf[i] = lgetc(lp, off);
			off++;
		}
	}
	buf[i] = '\0';
	return (i);
}